

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

int __thiscall QTabBarPrivate::indexAtPos(QTabBarPrivate *this,QPoint *p)

{
  undefined1 uVar1;
  ulong uVar2;
  QList<QTabBarPrivate::Tab_*> *this_00;
  qsizetype qVar3;
  const_reference ppTVar4;
  undefined8 in_RSI;
  QTabBarPrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  QTabBar *q;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  int local_4c;
  QTabBarPrivate *this_01;
  int local_2c;
  QRect local_28;
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  q_func(in_RDI);
  local_18 = QTabBar::tabRect((QTabBar *)this_01,(int)((ulong)in_RSI >> 0x20));
  uVar2 = QRect::contains((QPoint *)&local_18,SUB81(in_RSI,0));
  if ((uVar2 & 1) == 0) {
    local_4c = 0;
    while( true ) {
      this_00 = (QList<QTabBarPrivate::Tab_*> *)(long)local_4c;
      qVar3 = QList<QTabBarPrivate::Tab_*>::size(&in_RDI->tabList);
      if (qVar3 <= (long)this_00) break;
      ppTVar4 = QList<QTabBarPrivate::Tab_*>::at
                          (this_00,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c & 0xffffff;
      if (((*ppTVar4)->field_0xe4 & 1) != 0) {
        local_28 = QTabBar::tabRect((QTabBar *)this_01,(int)((ulong)in_RSI >> 0x20));
        uVar1 = QRect::contains((QPoint *)&local_28,SUB81(in_RSI,0));
        in_stack_ffffffffffffff9c = CONCAT13(uVar1,(int3)in_stack_ffffffffffffff9c);
      }
      if ((in_stack_ffffffffffffff9c & 0x1000000) != 0) {
        local_2c = local_4c;
        goto LAB_006a99bf;
      }
      local_4c = local_4c + 1;
    }
    local_2c = -1;
  }
  else {
    local_2c = in_RDI->currentIndex;
  }
LAB_006a99bf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

int QTabBarPrivate::indexAtPos(const QPoint &p) const
{
    Q_Q(const QTabBar);
    if (q->tabRect(currentIndex).contains(p))
        return currentIndex;
    for (int i = 0; i < tabList.size(); ++i)
        if (tabList.at(i)->enabled && q->tabRect(i).contains(p))
            return i;
    return -1;
}